

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O2

void __thiscall
duckdb::Linenoise::EditCapitalizeNextWord(Linenoise *this,Capitalization capitalization)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  byte bVar6;
  
  uVar2 = this->pos;
  uVar5 = this->len;
  uVar4 = uVar5;
  if (uVar5 < uVar2) {
    uVar4 = uVar2;
  }
  while (((uVar3 = uVar4, uVar2 < uVar5 && (uVar3 = uVar2, (ulong)(byte)this->buf[uVar2] < 0x21)) &&
         ((0x100002600U >> ((ulong)(byte)this->buf[uVar2] & 0x3f) & 1) != 0))) {
    uVar2 = uVar2 + 1;
  }
  bVar1 = 1;
  for (; uVar3 < uVar5; uVar3 = uVar3 + 1) {
    bVar6 = this->buf[uVar3];
    if (((ulong)bVar6 < 0x21) && ((0x100002600U >> ((ulong)bVar6 & 0x3f) & 1) != 0)) break;
    if (capitalization == UPPERCASE) {
      if ((byte)(bVar6 + 0x9f) < 0x1a) {
        bVar6 = bVar6 - 0x20;
LAB_001ef809:
        this->buf[uVar3] = bVar6;
      }
    }
    else if (capitalization == LOWERCASE) {
      if ((byte)(bVar6 + 0xbf) < 0x1a) {
        bVar6 = bVar6 | 0x20;
        goto LAB_001ef809;
      }
    }
    else if (capitalization == CAPITALIZE) {
      if (!(bool)(~bVar1 & 1 | 0x19 < (byte)(bVar6 + 0x9f))) {
        bVar6 = bVar6 - 0x20;
        bVar1 = 0;
        goto LAB_001ef809;
      }
      bVar1 = 0;
    }
    uVar5 = this->len;
  }
  this->pos = uVar3;
  RefreshLine(this);
  return;
}

Assistant:

void Linenoise::EditCapitalizeNextWord(Capitalization capitalization) {
	size_t next_pos = pos;

	// find the next word
	while (next_pos < len && IsSpace(buf[next_pos])) {
		next_pos++;
	}
	bool first_char = true;
	while (next_pos < len && !IsSpace(buf[next_pos])) {
		switch (capitalization) {
		case Capitalization::CAPITALIZE: {
			if (first_char) {
				first_char = false;
				if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
					buf[next_pos] -= 'a' - 'A';
				}
			}
			break;
		}
		case Capitalization::LOWERCASE: {
			if (buf[next_pos] >= 'A' && buf[next_pos] <= 'Z') {
				buf[next_pos] += 'a' - 'A';
			}
			break;
		}
		case Capitalization::UPPERCASE: {
			if (buf[next_pos] >= 'a' && buf[next_pos] <= 'z') {
				buf[next_pos] -= 'a' - 'A';
			}
			break;
		}
		default:
			break;
		}
		next_pos++;
	}
	pos = next_pos;
	RefreshLine();
}